

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

ObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateObservationHistoryTree(PlanningUnitMADPDiscrete *this,Index agentI)

{
  size_t sVar1;
  ulong uVar2;
  pointer pvVar3;
  long lVar4;
  Index IVar5;
  size_t o;
  ObservationHistory *pOVar6;
  ObservationHistoryTree *pOVar7;
  size_type sVar8;
  ostream *poVar9;
  TreeNode<ObservationHistory> *suc;
  ObservationHistoryTree *pOVar10;
  uint uVar11;
  uint local_cc;
  ObservationHistoryTree *oht;
  long local_b8;
  ObservationHistoryTree *local_b0;
  ObservationHistoryTree *local_a8;
  ObservationHistoryTree *next_oht;
  ulong local_98;
  ulong local_90;
  ObservationHistoryTree *root;
  queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
  ohtQueue;
  
  uVar2 = (ulong)agentI;
  std::
  queue<ObservationHistoryTree*,std::deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>>
  ::queue<std::deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>,void>
            (&ohtQueue);
  sVar1 = (this->super_PlanningUnit)._m_horizon;
  o = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,uVar2);
  next_oht = (ObservationHistoryTree *)0x0;
  pOVar6 = (ObservationHistory *)operator_new(0x30);
  ObservationHistory::ObservationHistory(pOVar6,this,agentI);
  pOVar7 = (ObservationHistoryTree *)operator_new(0x58);
  ObservationHistoryTree::ObservationHistoryTree(pOVar7,pOVar6);
  root = pOVar7;
  std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::push_back
            (&ohtQueue.c,&root);
  local_b8 = uVar2 * 0x18;
  oht = (ObservationHistoryTree *)0x0;
  local_98 = uVar2;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  emplace_back<unsigned_long_long>
            ((this->_m_firstOHIforT).
             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar2,(unsigned_long_long *)&oht);
  local_90 = sVar1 + 0xffffffff & 0xffffffff;
  pOVar7 = (ObservationHistoryTree *)0x0;
  local_cc = 0;
  while( true ) {
    sVar8 = std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::size
                      (&ohtQueue.c);
    lVar4 = local_b8;
    local_b0 = pOVar7;
    if (sVar8 == 0) break;
    oht = *ohtQueue.c.
           super__Deque_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
    (oht->super_TreeNode<ObservationHistory>)._m_index = (LIndex)pOVar7;
    (oht->super_TreeNode<ObservationHistory>)._m_indexValid = true;
    std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::push_back
              ((vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_> *)
               ((long)&(((this->_m_observationHistoryTreeVectors).
                         super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                       )._M_impl.super__Vector_impl_data + local_b8),&oht);
    uVar2 = (((oht->super_TreeNode<ObservationHistory>)._m_containedElem)->super_IndividualHistory).
            super_History._m_length;
    uVar11 = (uint)uVar2;
    if (local_cc != uVar11) {
      IVar5 = Globals::CastLIndexToIndex
                        (*(LIndex *)
                          (*(long *)((long)&(((this->_m_firstOHIforT).
                                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                            )._M_impl.super__Vector_impl_data + local_b8) +
                          (ulong)local_cc * 8));
      local_a8 = (ObservationHistoryTree *)(ulong)((int)local_b0 - IVar5);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->_m_nrObservationHistoriesT).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + local_b8),(unsigned_long *)&local_a8);
      local_cc = local_cc + 1;
      if (local_cc != uVar11) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "ERROR: CreateObservationHistories:  ++ts != ");
        poVar9 = std::operator<<(poVar9,"(Index) thisLength !!! ts (now) is: ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,"thisLength =");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      local_a8 = pOVar7;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      emplace_back<unsigned_long_long>
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 ((long)&(((this->_m_firstOHIforT).
                           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         )._M_impl.super__Vector_impl_data + local_b8),
                 (unsigned_long_long *)&local_a8);
    }
    if (uVar2 < local_90) {
      for (uVar11 = 0; uVar11 < o; uVar11 = uVar11 + 1) {
        pOVar6 = (ObservationHistory *)operator_new(0x30);
        ObservationHistory::ObservationHistory
                  (pOVar6,uVar11,(oht->super_TreeNode<ObservationHistory>)._m_containedElem);
        suc = (TreeNode<ObservationHistory> *)operator_new(0x58);
        ObservationHistoryTree::ObservationHistoryTree((ObservationHistoryTree *)suc,pOVar6);
        next_oht = (ObservationHistoryTree *)suc;
        TreeNode<ObservationHistory>::SetSuccessor
                  (&oht->super_TreeNode<ObservationHistory>,(ulong)uVar11,suc);
        std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::push_back
                  (&ohtQueue.c,&next_oht);
      }
    }
    pOVar7 = (ObservationHistoryTree *)(ulong)((int)local_b0 + 1);
    std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::pop_front
              (&ohtQueue.c);
  }
  IVar5 = Globals::CastLIndexToIndex
                    (*(LIndex *)
                      (*(long *)((long)&(((this->_m_firstOHIforT).
                                          super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                        )._M_impl.super__Vector_impl_data + local_b8) +
                      (ulong)local_cc * 8));
  oht = (ObservationHistoryTree *)(ulong)((int)local_b0 - IVar5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(((this->_m_nrObservationHistoriesT).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data + lVar4),(unsigned_long *)&oht);
  pOVar10 = (ObservationHistoryTree *)
            IndexTools::CalculateNumberOfSequences(o,(this->super_PlanningUnit)._m_horizon - 1);
  if ((pOVar10 != pOVar7) ||
     (pvVar3 = (this->_m_observationHistoryTreeVectors).
               super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (ObservationHistoryTree *)
     (*(long *)((long)&(pvVar3->
                       super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                       )._M_impl.super__Vector_impl_data + lVar4 + 8) -
      *(long *)((long)&(pvVar3->
                       super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                       )._M_impl.super__Vector_impl_data + lVar4) >> 3) != pOVar7)) {
    poVar9 = std::operator<<((ostream *)&std::cerr," WARNING:ObservationHistoryIndex=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," nrObsHist=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," _m_observationHistoryTreeVectors[agentI=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9,"].size()=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  oht = pOVar7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->_m_nrObservationHistories,(unsigned_long *)&oht);
  pOVar7 = root;
  std::_Deque_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::
  ~_Deque_base((_Deque_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_> *)
               &ohtQueue);
  return pOVar7;
}

Assistant:

ObservationHistoryTree*
PlanningUnitMADPDiscrete::CreateObservationHistoryTree(Index agentI)
{
    //we want to number the Observation Histories breadth-first, so we 
    //use a queue:
    queue<ObservationHistoryTree*> ohtQueue;
    
    Index ObservationHistoryIndex = 0;
    Index maxLength = GetHorizon()-1;//max. observation hist length = h-1
    size_t nrO = GetNrObservations(agentI);
    ObservationHistory* next_oh = 0;
    ObservationHistoryTree* next_oht = 0;
    
    // return a new initial (=empty) observation history

    ObservationHistory* oh = new ObservationHistory(*this, agentI);
    ObservationHistoryTree* root = new ObservationHistoryTree(oh);//, nrO);
    ohtQueue.push(root);

    Index ts = 0;
    _m_firstOHIforT[agentI].push_back(ObservationHistoryIndex);
    while(ohtQueue.size() > 0)
    {
        ObservationHistoryTree* oht = ohtQueue.front();
        oht->SetIndex(ObservationHistoryIndex);
        _m_observationHistoryTreeVectors[agentI].push_back(oht);

        size_t thisLength = oht->GetContainedElement()->GetLength(); 
        if(ts != (Index) thisLength) //length 1 <-> ts 1 
        {
            // we've now started processing OHs for the next ts
            Index nr_OHI_for_ts = ObservationHistoryIndex - 
                CastLIndexToIndex(_m_firstOHIforT[agentI][ts]);
#if DEBUG_PUDCOHT
            cout << "First oh for next ts+1: store nr of ts-OH..."<<endl<<
                "_m_firstOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstOHIforT[agentI][ts] << ", current OHI = " <<
                ObservationHistoryIndex << endl;
            Index tempIndex = _m_nrObservationHistoriesT[agentI].size();
#endif
            _m_nrObservationHistoriesT[agentI].push_back(nr_OHI_for_ts); 
#if DEBUG_PUDCOHT
            cout << "Set _m_nrObservationHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_OHI_for_ts << endl;
#endif
            if(++ts != (Index) thisLength )
                cout << "ERROR: CreateObservationHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength =" << thisLength <<endl;
            _m_firstOHIforT[agentI].push_back(ObservationHistoryIndex);            
        }
        
        ObservationHistoryIndex++; //index of an Observation HISTORY
        
        if(thisLength < maxLength)
            for(Index obsI = 0; obsI < nrO; obsI++) //obsI = observation index
            {
                next_oh = new ObservationHistory(obsI, 
                    oht->GetObservationHistory());
                next_oht = new ObservationHistoryTree(next_oh);//, nrO);
                oht->SetSuccessor(obsI, next_oht);
                ohtQueue.push(next_oht);
            }
        ohtQueue.pop();
    }    

    //there is no next time step, so _m_nrObservationHistoriesT[agentI][lastTs]
    //have not been stored yet: do this now
    Index nr_OHI_for_ts = (ObservationHistoryIndex) 
        - CastLIndexToIndex(_m_firstOHIforT[agentI][ts]);
#if DEBUG_PUDCOHT
    cout << "Last ts end: store nr of ts=h-1 OH..."<<endl<<
        "_m_firstOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
        _m_firstOHIforT[agentI][ts] << ", current OHI = " <<
        ObservationHistoryIndex << endl;
    Index tempIndex = _m_nrObservationHistoriesT[agentI].size();
#endif
    _m_nrObservationHistoriesT[agentI].push_back(nr_OHI_for_ts);
#if DEBUG_PUDCOHT
    cout << "Set _m_nrObservationHistoriesT[agentI="<<agentI<<"][t="<<tempIndex
         <<" (last time step ts="<<ts<<")] = "<< nr_OHI_for_ts<<endl;
#endif
    //in a horizon h MADP without initial observation, the max. observation 
    //sequence length is h-1 observations (and the minimum is 0).
    size_t nrObsHist;
    size_t length = GetHorizon() - 1; // = maxLength - 1
    nrObsHist = IndexTools::CalculateNumberOfSequences(nrO, length);

    if( ObservationHistoryIndex != nrObsHist || 
        nrObsHist != _m_observationHistoryTreeVectors[agentI].size() )
        cerr << " WARNING:ObservationHistoryIndex="<< ObservationHistoryIndex <<
        " nrObsHist=" << nrObsHist <<" _m_observationHistoryTreeVectors[agentI="
        << agentI<<"].size()=" << _m_observationHistoryTreeVectors[agentI].size()
        << endl;
    
    _m_nrObservationHistories.push_back(ObservationHistoryIndex);

    return(root);
}